

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# duckdb_log_contexts.cpp
# Opt level: O2

unique_ptr<duckdb::GlobalTableFunctionState,_std::default_delete<duckdb::GlobalTableFunctionState>,_true>
 duckdb::DuckDBLogContextInit(ClientContext *context,TableFunctionInitInput *input)

{
  bool bVar1;
  LogManager *this;
  pointer *__ptr;
  element_type *local_28;
  element_type *local_20;
  
  this = LogManager::Get((ClientContext *)input);
  bVar1 = LogManager::CanScan(this);
  if (bVar1) {
    LogManager::Get((ClientContext *)input);
    LogManager::GetLogStorage((LogManager *)&stack0xffffffffffffffe0);
    make_uniq<duckdb::DuckDBLogContextData,duckdb::shared_ptr<duckdb::LogStorage,true>>
              ((duckdb *)&local_28,(shared_ptr<duckdb::LogStorage,_true> *)&stack0xffffffffffffffe0)
    ;
    (context->super_enable_shared_from_this<duckdb::ClientContext>).__weak_this_.internal.
    super___weak_ptr<duckdb::ClientContext,_(__gnu_cxx::_Lock_policy)2>._M_ptr = local_28;
    local_28 = (element_type *)0x0;
    ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&stack0xffffffffffffffe8);
  }
  else {
    make_uniq<duckdb::DuckDBLogContextData>();
    (context->super_enable_shared_from_this<duckdb::ClientContext>).__weak_this_.internal.
    super___weak_ptr<duckdb::ClientContext,_(__gnu_cxx::_Lock_policy)2>._M_ptr = local_20;
  }
  return (unique_ptr<duckdb::GlobalTableFunctionState,_std::default_delete<duckdb::GlobalTableFunctionState>_>
          )(unique_ptr<duckdb::GlobalTableFunctionState,_std::default_delete<duckdb::GlobalTableFunctionState>_>
            )context;
}

Assistant:

unique_ptr<GlobalTableFunctionState> DuckDBLogContextInit(ClientContext &context, TableFunctionInitInput &input) {
	if (LogManager::Get(context).CanScan()) {
		return make_uniq<DuckDBLogContextData>(LogManager::Get(context).GetLogStorage());
	}
	return make_uniq<DuckDBLogContextData>();
}